

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aho-corasick-lite.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  uint32_t uVar1;
  ostream *poVar2;
  clock_t cVar3;
  clock_t cVar4;
  Trie *this;
  undefined8 *in_RSI;
  int in_EDI;
  Trie *in_stack_00000020;
  int total;
  time_t time_e;
  time_t time_s;
  Trie trie;
  char *in_stack_000001b0;
  Trie *in_stack_000001b8;
  char *in_stack_00000258;
  Trie *in_stack_00000260;
  Trie *in_stack_ffffffffffffff50;
  Trie local_50;
  undefined8 *local_10;
  int local_4;
  
  local_4 = 0;
  if (in_EDI < 3) {
    local_10 = in_RSI;
    poVar2 = std::operator<<((ostream *)&std::cout,"usage ");
    poVar2 = std::operator<<(poVar2,(char *)*local_10);
    poVar2 = std::operator<<(poVar2," dictfilePath textfilePath");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    local_4 = 0;
  }
  else {
    Trie::Trie(in_stack_ffffffffffffff50);
    cVar3 = clock();
    Trie::loadDict(in_stack_000001b8,in_stack_000001b0);
    cVar4 = clock();
    poVar2 = std::operator<<((ostream *)&std::cout," success in loadDict in ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(double)(cVar4 - cVar3) / 1000000.0);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout," insert ");
    uVar1 = Trie::getSize(&local_50);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar1);
    poVar2 = std::operator<<(poVar2," words");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"begin build clue");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    cVar3 = clock();
    Trie::buildClue(in_stack_00000020);
    cVar4 = clock();
    poVar2 = std::operator<<((ostream *)&std::cout," success in build clue in ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(double)(cVar4 - cVar3) / 1000000.0);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    cVar3 = clock();
    Trie::matchTextFile(in_stack_00000260,in_stack_00000258);
    cVar4 = clock();
    poVar2 = std::operator<<((ostream *)&std::cout," success in matchFile in ");
    this = (Trie *)std::ostream::operator<<(poVar2,(double)(cVar4 - cVar3) / 1000000.0);
    poVar2 = std::operator<<((ostream *)this," total Null nodes : ");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    getchar();
    local_4 = 0;
    Trie::~Trie(this);
  }
  return local_4;
}

Assistant:

int main(int argc, char* argv[])
{
	if (argc < 3) {
	    cout << "usage " << argv[0] << " dictfilePath textfilePath" << endl;
	    return 0;
	}

	Trie trie;
	time_t time_s, time_e;
	time_s = clock();
	trie.loadDict(argv[1]);
	time_e = clock();
	cout << " success in loadDict in " << (double)(time_e - time_s)/CLOCKS_PER_SEC << endl;
	cout << " insert " << trie.getSize() << " words" << endl;

	cout << "begin build clue" << endl;
	time_s = clock();
	trie.buildClue();
	time_e = clock();
	cout << " success in build clue in " << (double)(time_e - time_s)/CLOCKS_PER_SEC << endl;

	int total = 0;

	time_s = clock();
    trie.matchTextFile(argv[2]);
    time_e = clock();
    cout << " success in matchFile in " << (double)(time_e - time_s)/CLOCKS_PER_SEC <<  " total Null nodes : " << endl;

    getchar();
	return 0;
}